

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_read_string(mg_session *session,mg_string **str)

{
  int iVar1;
  undefined8 in_RAX;
  mg_string *pmVar2;
  ulong __n;
  uint32_t size;
  
  size = (uint32_t)((ulong)in_RAX >> 0x20);
  iVar1 = mg_session_read_container_size(session,&size,MG_MARKERS_STRING);
  if (iVar1 == 0) {
    __n = (ulong)size;
    if (session->in_end < session->in_cursor + __n) {
      mg_session_set_error(session,"unexpected end of message");
      iVar1 = -6;
    }
    else {
      pmVar2 = mg_string_alloc(size,session->decoder_allocator);
      if (pmVar2 == (mg_string *)0x0) {
        mg_session_set_error(session,"out of memory");
        iVar1 = -3;
      }
      else {
        pmVar2->size = size;
        memcpy(pmVar2->data,session->in_buffer + session->in_cursor,__n);
        session->in_cursor = session->in_cursor + __n;
        *str = pmVar2;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_string(mg_session *session, mg_string **str) {
  uint32_t size;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &size, MG_MARKERS_STRING));

  if (session->in_cursor + size > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }

  mg_string *tstr = mg_string_alloc(size, session->decoder_allocator);
  if (!tstr) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  tstr->size = size;
  memcpy(tstr->data, session->in_buffer + session->in_cursor, size);
  session->in_cursor += size;
  *str = tstr;
  return 0;
}